

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O1

bool __thiscall
senjo::PerftCommandHandle::Process
          (PerftCommandHandle *this,char *params,uint64_t *count,uint64_t *nodes,uint64_t *qnodes)

{
  char *pcVar1;
  ChessEngine *pCVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  uint64_t uVar6;
  int depth;
  ulong uVar7;
  byte bVar8;
  char *pcVar9;
  uint64_t node_count;
  uint64_t qnode_count;
  Output local_58;
  Output local_50;
  uint64_t *local_48;
  uint64_t *local_40;
  long local_38;
  
  pcVar9 = params + 1;
  uVar4 = (int)params[1] - 0x30;
  depth = 0;
  if (uVar4 < 10) {
    depth = 0;
    do {
      depth = uVar4 + depth * 10;
      pcVar1 = pcVar9 + 1;
      pcVar9 = pcVar9 + 1;
      uVar4 = (int)*pcVar1 - 0x30;
    } while (uVar4 < 10);
  }
  bVar8 = 1;
  if ((depth != 0) && ((this->maxDepth == 0 || (depth <= this->maxDepth)))) {
    cVar3 = *pcVar9;
    local_48 = nodes;
    local_40 = qnodes;
    while ((cVar3 != '\0' && (iVar5 = isspace((int)cVar3), iVar5 != 0))) {
      cVar3 = pcVar9[1];
      pcVar9 = pcVar9 + 1;
    }
    iVar5 = (int)*pcVar9;
    if (iVar5 - 0x30U < 10) {
      uVar7 = 0;
      do {
        pcVar9 = pcVar9 + 1;
        uVar7 = ((long)(char)iVar5 + uVar7 * 10) - 0x30;
        iVar5 = (int)*pcVar9;
      } while (iVar5 - 0x30U < 10);
    }
    else {
      uVar7 = 0;
    }
    if ((uVar7 != 0) && ((this->maxLeafs == 0 || (uVar7 <= this->maxLeafs)))) {
      Output::Output(&local_58,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- ",4);
      std::ostream::operator<<((ostream *)&std::cout,depth);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," => ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      Output::~Output(&local_58);
      pCVar2 = (this->super_BackgroundCommand).engine;
      if (this->qperft == true) {
        uVar6 = ChessEngine::QPerft(pCVar2,depth);
      }
      else {
        uVar6 = ChessEngine::Perft(pCVar2,depth);
      }
      local_58._vptr_Output = (_func_int **)0x0;
      local_38 = 0;
      pCVar2 = (this->super_BackgroundCommand).engine;
      (*pCVar2->_vptr_ChessEngine[0x10])(pCVar2,0,0,&local_58,&local_38,0,0,0,0);
      *count = *count + uVar6;
      *local_48 = *local_48 + (long)local_58._vptr_Output;
      *local_40 = *local_40 + local_38;
      bVar8 = uVar6 == uVar7 | this->qperft;
      if (bVar8 == 0) {
        Output::Output(&local_50,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- ",4);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        Output::~Output(&local_50);
      }
    }
  }
  return (bool)bVar8;
}

Assistant:

bool PerftCommandHandle::Process(const char* params, uint64_t& count,
                                 uint64_t& nodes, uint64_t& qnodes)
{
  const char* p = (params + 1);
  int depth = 0;
  while (*p && isdigit(*p)) {
    depth = ((10 * depth) + (*p++ - '0'));
    if (depth < 0) {
      Output() << "invalid depth: " << params;
      return true;
    }
  }
  if (!depth || (maxDepth && (depth > maxDepth))) {
    return true;
  }

  NextWord(p);

  uint64_t expected = 0;
  while (*p && isdigit(*p)) {
    expected = ((10 * expected) + (*p++ - '0'));
  }
  if (!expected || (maxLeafs && (expected > maxLeafs))) {
    return true;
  }

  Output() << "--- " << depth << " => " << expected;
  uint64_t perft_count = qperft ? engine->QPerft(depth) : engine->Perft(depth);
  uint64_t node_count = 0;
  uint64_t qnode_count = 0;

  engine->GetStats(NULL, NULL, &node_count, &qnode_count);
  count += perft_count;
  nodes += node_count;
  qnodes += qnode_count;

  if (!qperft && (perft_count != expected)) {
    Output() << "--- " << perft_count << " != " << expected;
    return false;
  }

  return true;
}